

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_hash.c
# Opt level: O2

void gravity_hash_iterate3
               (gravity_hash_t *hashtable,gravity_hash_iterate3_fn iterate,void *data1,void *data2,
               void *data3)

{
  ulong uVar1;
  hash_node_t *phVar2;
  
  if (iterate != (gravity_hash_iterate3_fn)0x0 && hashtable != (gravity_hash_t *)0x0) {
    for (uVar1 = 0; uVar1 < hashtable->size; uVar1 = uVar1 + 1) {
      phVar2 = hashtable->nodes[uVar1];
      if (phVar2 != (hash_node_t *)0x0) {
        for (; phVar2 != (hash_node_t *)0x0; phVar2 = phVar2->next) {
          (*iterate)(hashtable,phVar2->key,phVar2->value,data1,data2,data3);
        }
      }
    }
  }
  return;
}

Assistant:

void gravity_hash_iterate3 (gravity_hash_t *hashtable, gravity_hash_iterate3_fn iterate, void *data1, void *data2, void *data3) {
    if ((!hashtable) || (!iterate)) return;
    
    for (uint32_t i=0; i<hashtable->size; ++i) {
        hash_node_t *node = hashtable->nodes[i];
        if (!node) continue;
        
        while (node) {
            iterate(hashtable, node->key, node->value, data1, data2, data3);
            node = node->next;
        }
    }
}